

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O3

bool __thiscall MeCab::DecoderFeatureIndex::openTextModel(DecoderFeatureIndex *this,Param *param)

{
  uint *puVar1;
  size_type sVar2;
  char *r;
  ulong uVar3;
  size_type sVar4;
  string modelfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Param::get<std::__cxx11::string>(&local_38,param,"model");
  FeatureIndex::convert(param,local_38._M_dataplus._M_p,&this->model_buffer_);
  puVar1 = (uint *)(this->model_buffer_)._M_dataplus._M_p;
  sVar2 = (this->model_buffer_)._M_string_length;
  uVar3 = (ulong)*puVar1;
  (this->super_FeatureIndex).maxid_ = uVar3;
  sVar4 = uVar3 * 0x10 + 0x24;
  if (sVar4 == sVar2) {
    this->charset_ = (char *)(puVar1 + 1);
    (this->super_FeatureIndex).alpha_ = (double *)(puVar1 + 9);
    this->key_ = (uint64_t *)(puVar1 + uVar3 * 2 + 9);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return sVar4 == sVar2;
}

Assistant:

bool DecoderFeatureIndex::openTextModel(const Param &param) {
  const std::string modelfile = param.get<std::string>("model");
  CHECK_DIE(FeatureIndex::convert(param, modelfile.c_str(), &model_buffer_));
  return openFromArray(model_buffer_.data(),
                       model_buffer_.data() + model_buffer_.size());
}